

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O0

Image * rw::readTGA(char *filename)

{
  Image *pIVar1;
  uint8 uVar2;
  int iVar3;
  size_t __nbytes;
  void *__buf;
  ulong uVar4;
  int local_e8;
  uint8 *local_c8;
  int local_ac;
  uint8 *puStack_a8;
  int x;
  uint8 *line;
  uint8 *puStack_98;
  int y;
  uint8 *pixels;
  int i;
  int maxlen;
  uint8 (*color) [4];
  uint8 *palette;
  undefined1 local_68 [8];
  StreamMemory file;
  uint8 *data;
  int local_38;
  uint32 length;
  int palDepth;
  int depth;
  Image *image;
  short local_1e;
  TGAHeader header;
  char *filename_local;
  
  length = 0;
  local_38 = 0;
  header._12_8_ = filename;
  file._24_8_ = getFileContents(filename,(uint32 *)((long)&data + 4));
  StreamMemory::StreamMemory((StreamMemory *)local_68);
  __nbytes = 0;
  StreamMemory::open((StreamMemory *)local_68,(char *)file._24_8_,data._4_4_);
  TGAHeader::read((TGAHeader *)((long)&image + 4),(int)local_68,__buf,__nbytes);
  StreamMemory::seek((StreamMemory *)local_68,(int)image._4_1_,1);
  if (image._5_1_ == '\0') {
    length = (uint32)(byte)header.xOrigin;
  }
  else {
    length = 8;
    if (local_1e < 0x11) {
      length = 4;
    }
    local_38 = (int)header.IDlen;
  }
  uVar4 = (ulong)(uint)(int)(short)header._8_2_;
  _palDepth = Image::create((int)header.colorMapLength,(int)(short)header._8_2_,length);
  Image::allocate(_palDepth);
  if (image._5_1_ == '\0') {
    local_c8 = (uint8 *)0x0;
  }
  else {
    local_c8 = _palDepth->palette;
  }
  if (local_c8 != (uint8 *)0x0) {
    iVar3 = 0x100;
    if (length == 4) {
      iVar3 = 0x10;
    }
    for (pixels._0_4_ = 0; (int)pixels < local_1e; pixels._0_4_ = (int)pixels + 1) {
      uVar2 = Stream::readU8((Stream *)local_68);
      local_c8[(long)(int)pixels * 4 + 2] = uVar2;
      uVar2 = Stream::readU8((Stream *)local_68);
      local_c8[(long)(int)pixels * 4 + 1] = uVar2;
      uVar2 = Stream::readU8((Stream *)local_68);
      local_c8[(long)(int)pixels * 4] = uVar2;
      local_c8[(long)(int)pixels * 4 + 3] = 0xff;
      if (local_38 == 0x20) {
        uVar2 = Stream::readU8((Stream *)local_68);
        local_c8[(long)(int)pixels * 4 + 3] = uVar2;
      }
    }
    for (; (int)pixels < iVar3; pixels._0_4_ = (int)pixels + 1) {
      local_c8[(long)(int)pixels * 4 + 2] = '\0';
      local_c8[(long)(int)pixels * 4 + 1] = '\0';
      local_c8[(long)(int)pixels * 4] = '\0';
      local_c8[(long)(int)pixels * 4 + 3] = 0xff;
    }
  }
  puStack_98 = _palDepth->pixels;
  if ((header.xOrigin._1_1_ & 0x20) == 0) {
    puStack_98 = puStack_98 + (_palDepth->height + -1) * _palDepth->stride;
  }
  for (line._4_4_ = 0; line._4_4_ < _palDepth->height; line._4_4_ = line._4_4_ + 1) {
    puStack_a8 = puStack_98;
    for (local_ac = 0; local_ac < _palDepth->width; local_ac = local_ac + 1) {
      switch(_palDepth->depth) {
      case 4:
      case 8:
        uVar2 = Stream::readU8((Stream *)local_68);
        *puStack_a8 = uVar2;
        break;
      case 0x10:
        uVar2 = Stream::readU8((Stream *)local_68);
        *puStack_a8 = uVar2;
        uVar2 = Stream::readU8((Stream *)local_68);
        puStack_a8[1] = uVar2;
        break;
      case 0x18:
        uVar2 = Stream::readU8((Stream *)local_68);
        puStack_a8[2] = uVar2;
        uVar2 = Stream::readU8((Stream *)local_68);
        puStack_a8[1] = uVar2;
        uVar2 = Stream::readU8((Stream *)local_68);
        *puStack_a8 = uVar2;
        break;
      case 0x20:
        uVar2 = Stream::readU8((Stream *)local_68);
        puStack_a8[2] = uVar2;
        uVar2 = Stream::readU8((Stream *)local_68);
        puStack_a8[1] = uVar2;
        uVar2 = Stream::readU8((Stream *)local_68);
        *puStack_a8 = uVar2;
        uVar2 = Stream::readU8((Stream *)local_68);
        puStack_a8[3] = uVar2;
      }
      puStack_a8 = puStack_a8 + _palDepth->bpp;
    }
    if ((header.xOrigin._1_1_ & 0x20) == 0) {
      local_e8 = -_palDepth->stride;
    }
    else {
      local_e8 = _palDepth->stride;
    }
    puStack_98 = puStack_98 + local_e8;
  }
  StreamMemory::close((StreamMemory *)local_68,(int)uVar4);
  (*DAT_001660a8)(file._24_8_);
  pIVar1 = _palDepth;
  StreamMemory::~StreamMemory((StreamMemory *)local_68);
  return pIVar1;
}

Assistant:

Image*
readTGA(const char *filename)
{
	TGAHeader header;
	Image *image;
	int depth = 0, palDepth = 0;
	uint32 length;
	uint8 *data = getFileContents(filename, &length);
	assert(data != nil);
	StreamMemory file;
	file.open(data, length);
	header.read(&file);

	assert(header.imageType == 1 || header.imageType == 2);
	file.seek(header.IDlen);
	if(header.colorMapType){
		assert(header.colorMapOrigin == 0);
		depth = (header.colorMapLength <= 16) ? 4 : 8;
		palDepth = header.colorMapDepth;
		assert(palDepth == 24 || palDepth == 32);
	}else{
		depth = header.depth;
		assert(depth == 16 || depth == 24 || depth == 32);
	}

	image = Image::create(header.width, header.height, depth);
	image->allocate();
	uint8 *palette = header.colorMapType ? image->palette : nil;
	uint8 (*color)[4] = nil;
	if(palette){
		int maxlen = depth == 4 ? 16 : 256;
		color = (uint8(*)[4])palette;
		int i;
		for(i = 0; i < header.colorMapLength; i++){
			color[i][2] = file.readU8();
			color[i][1] = file.readU8();
			color[i][0] = file.readU8();
			color[i][3] = 0xFF;
			if(palDepth == 32)
				color[i][3] = file.readU8();
		}
		for(; i < maxlen; i++){
			color[i][0] = color[i][1] = color[i][2] = 0;
			color[i][3] = 0xFF;
		}
	}

	uint8 *pixels = image->pixels;
	if(!(header.descriptor & 0x20))
		pixels += (image->height-1)*image->stride;
	for(int y = 0; y < image->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
			case 8:
				line[0] = file.readU8();
				break;
			case 16:
				line[0] = file.readU8();
				line[1] = file.readU8();
				break;
			case 24:
				line[2] = file.readU8();
				line[1] = file.readU8();
				line[0] = file.readU8();
				break;
			case 32:
				line[2] = file.readU8();
				line[1] = file.readU8();
				line[0] = file.readU8();
				line[3] = file.readU8();
				break;
			}
			line += image->bpp;
		}
		pixels += (header.descriptor&0x20) ?
		              image->stride : -image->stride;
	}

	file.close();
	rwFree(data);
	return image;
}